

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O0

WJTL_STATUS TestComments(void)

{
  JL_STATUS JVar1;
  int iVar2;
  bool bVar3;
  _Bool _result_24;
  _Bool _result_23;
  _Bool _result_22;
  _Bool _result_21;
  _Bool _result_20;
  _Bool _result_19;
  _Bool _result_18;
  _Bool _result_17;
  _Bool _result_16;
  _Bool _result_15;
  _Bool _result_14;
  _Bool _result_13;
  _Bool _result_12;
  _Bool _result_11;
  _Bool _result_10;
  _Bool _result_9;
  _Bool _result_8;
  _Bool _result_7;
  _Bool _result_6;
  _Bool _result_5;
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  _Bool _result_1;
  _Bool _result;
  char *stringPtr;
  uint64_t u64;
  size_t errorAtPos;
  JlDataObject *object;
  JlDataObject *objectTree;
  WJTL_STATUS TestReturn;
  
  objectTree._4_4_ = WJTL_STATUS_SUCCESS;
  object = (JlDataObject *)0x0;
  errorAtPos = 0;
  u64 = 100;
  __result_7 = (char *)0x0;
  JVar1 = JlParseJsonEx("// Comment\n1234// Comment\n//Comment",true,&object,&u64);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlParseJsonEx( \"// Comment\\n1234// Comment\\n//Comment\", 1, &objectTree, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x52b);
  if (JVar1 != JL_STATUS_SUCCESS) {
    objectTree._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = object != (JlDataObject *)0x0;
  WjTestLib_Assert(bVar3,"(objectTree) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x52c);
  if (!bVar3) {
    objectTree._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar1 = JlGetObjectNumberU64(object,(uint64_t *)&stringPtr);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlGetObjectNumberU64( objectTree, &u64 ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x52d);
  if (JVar1 != JL_STATUS_SUCCESS) {
    objectTree._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = stringPtr == (char *)0x4d2;
  WjTestLib_Assert(bVar3,"1234 == u64",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x52e);
  if (!bVar3) {
    objectTree._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar1 = JlFreeObjectTree(&object);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlFreeObjectTree( &objectTree ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x52f);
  if (JVar1 != JL_STATUS_SUCCESS) {
    objectTree._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar1 = JlParseJsonEx("// Comment\n\"abcd\"// Comment\n//Comment",true,&object,&u64);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlParseJsonEx( \"// Comment\\n\\\"abcd\\\"// Comment\\n//Comment\", 1, &objectTree, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x531);
  if (JVar1 != JL_STATUS_SUCCESS) {
    objectTree._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = object != (JlDataObject *)0x0;
  WjTestLib_Assert(bVar3,"(objectTree) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x532);
  if (!bVar3) {
    objectTree._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar1 = JlGetObjectString(object,(char **)&_result_7);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlGetObjectString( objectTree, &stringPtr ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x533);
  if (JVar1 != JL_STATUS_SUCCESS) {
    objectTree._4_4_ = WJTL_STATUS_FAILED;
  }
  iVar2 = strcmp(__result_7,"abcd");
  WjTestLib_Assert(iVar2 == 0,"strcmp( stringPtr, \"abcd\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x534);
  if (iVar2 != 0) {
    objectTree._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar1 = JlFreeObjectTree(&object);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlFreeObjectTree( &objectTree ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x535);
  if (JVar1 != JL_STATUS_SUCCESS) {
    objectTree._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar1 = JlParseJsonEx("/* Comment*/\n/*Comment*/5678/*Comment*/",true,&object,&u64);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlParseJsonEx( \"/* Comment*/\\n/*Comment*/5678/*Comment*/\", 1, &objectTree, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x537);
  if (JVar1 != JL_STATUS_SUCCESS) {
    objectTree._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = object != (JlDataObject *)0x0;
  WjTestLib_Assert(bVar3,"(objectTree) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x538);
  if (!bVar3) {
    objectTree._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar1 = JlGetObjectNumberU64(object,(uint64_t *)&stringPtr);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlGetObjectNumberU64( objectTree, &u64 ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x539);
  if (JVar1 != JL_STATUS_SUCCESS) {
    objectTree._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = stringPtr == (char *)0x162e;
  WjTestLib_Assert(bVar3,"5678 == u64",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x53a);
  if (!bVar3) {
    objectTree._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar1 = JlFreeObjectTree(&object);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlFreeObjectTree( &objectTree ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x53b);
  if (JVar1 != JL_STATUS_SUCCESS) {
    objectTree._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar1 = JlParseJsonEx("{\n  \"a\" : /* */ 1,\n //\"b\" : 2,\n /*       \n   //     */\n  //   /* junk\n /* */ \"c\"/*  *//**/ /*  */:/* */ 3/* */\n}\n"
                        ,true,&object,&u64);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlParseJsonEx( \"{\\n\" \"  \\\"a\\\" : /* */ 1,\\n\" \" //\\\"b\\\" : 2,\\n\" \" /*       \\n\" \"   //     */\\n\" \"  //   /* junk\\n\" \" /* */ \\\"c\\\"/*  *//**/ /*  */:/* */ 3/* */\\n\" \"}\\n\", 1, &objectTree, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x547);
  if (JVar1 != JL_STATUS_SUCCESS) {
    objectTree._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = object != (JlDataObject *)0x0;
  WjTestLib_Assert(bVar3,"(objectTree) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x548);
  if (!bVar3) {
    objectTree._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar1 = JlGetObjectFromDictionaryByKey(object,"a",(JlDataObject **)&errorAtPos);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlGetObjectFromDictionaryByKey( objectTree, \"a\", &object ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x54a);
  if (JVar1 != JL_STATUS_SUCCESS) {
    objectTree._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar1 = JlGetObjectNumberU64((JlDataObject *)errorAtPos,(uint64_t *)&stringPtr);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlGetObjectNumberU64( object, &u64 ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x54b);
  if (JVar1 != JL_STATUS_SUCCESS) {
    objectTree._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = stringPtr == (char *)0x1;
  WjTestLib_Assert(bVar3,"1 == u64",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x54c);
  if (!bVar3) {
    objectTree._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar1 = JlGetObjectFromDictionaryByKey(object,"b",(JlDataObject **)&errorAtPos);
  WjTestLib_Assert(JVar1 == JL_STATUS_NOT_FOUND,
                   "(JlGetObjectFromDictionaryByKey( objectTree, \"b\", &object )) == (JL_STATUS_NOT_FOUND)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x54d);
  if (JVar1 != JL_STATUS_NOT_FOUND) {
    objectTree._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar1 = JlGetObjectFromDictionaryByKey(object,"c",(JlDataObject **)&errorAtPos);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlGetObjectFromDictionaryByKey( objectTree, \"c\", &object ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x54e);
  if (JVar1 != JL_STATUS_SUCCESS) {
    objectTree._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar1 = JlGetObjectNumberU64((JlDataObject *)errorAtPos,(uint64_t *)&stringPtr);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlGetObjectNumberU64( object, &u64 ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x54f);
  if (JVar1 != JL_STATUS_SUCCESS) {
    objectTree._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(stringPtr == (char *)0x3,"3 == u64",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x550);
  if (stringPtr != (char *)0x3) {
    objectTree._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar1 = JlFreeObjectTree(&object);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlFreeObjectTree( &objectTree ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestComments",0x552);
  if (JVar1 != JL_STATUS_SUCCESS) {
    objectTree._4_4_ = WJTL_STATUS_FAILED;
  }
  return objectTree._4_4_;
}

Assistant:

static
WJTL_STATUS
    TestComments
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;
    JlDataObject* objectTree = NULL;
    JlDataObject* object = NULL;
    size_t errorAtPos = 100;
    uint64_t u64;
    char const* stringPtr = NULL;

    JL_ASSERT_SUCCESS( JlParseJsonEx( "// Comment\n1234// Comment\n//Comment", true, &objectTree, &errorAtPos ) );
    JL_ASSERT_NOT_NULL( objectTree );
    JL_ASSERT_SUCCESS( JlGetObjectNumberU64( objectTree, &u64 ) );
    JL_ASSERT( 1234 == u64 );
    JL_ASSERT_SUCCESS( JlFreeObjectTree( &objectTree ) );

    JL_ASSERT_SUCCESS( JlParseJsonEx( "// Comment\n\"abcd\"// Comment\n//Comment", true, &objectTree, &errorAtPos ) );
    JL_ASSERT_NOT_NULL( objectTree );
    JL_ASSERT_SUCCESS( JlGetObjectString( objectTree, &stringPtr ) );
    JL_ASSERT( strcmp( stringPtr, "abcd" ) == 0 );
    JL_ASSERT_SUCCESS( JlFreeObjectTree( &objectTree ) );

    JL_ASSERT_SUCCESS( JlParseJsonEx( "/* Comment*/\n/*Comment*/5678/*Comment*/", true, &objectTree, &errorAtPos ) );
    JL_ASSERT_NOT_NULL( objectTree );
    JL_ASSERT_SUCCESS( JlGetObjectNumberU64( objectTree, &u64 ) );
    JL_ASSERT( 5678 == u64 );
    JL_ASSERT_SUCCESS( JlFreeObjectTree( &objectTree ) );

    // complicated example
    JL_ASSERT_SUCCESS( JlParseJsonEx(
        "{\n"
        "  \"a\" : /* */ 1,\n"
        " //\"b\" : 2,\n"
        " /*       \n"
        "   //     */\n"
        "  //   /* junk\n"
        " /* */ \"c\"/*  *//**/ /*  */:/* */ 3/* */\n"
        "}\n",
        true, &objectTree, &errorAtPos ) );
    JL_ASSERT_NOT_NULL( objectTree );

    JL_ASSERT_SUCCESS( JlGetObjectFromDictionaryByKey( objectTree, "a", &object ) );
    JL_ASSERT_SUCCESS( JlGetObjectNumberU64( object, &u64 ) );
    JL_ASSERT( 1 == u64 );
    JL_ASSERT_STATUS( JlGetObjectFromDictionaryByKey( objectTree, "b", &object ), JL_STATUS_NOT_FOUND );
    JL_ASSERT_SUCCESS( JlGetObjectFromDictionaryByKey( objectTree, "c", &object ) );
    JL_ASSERT_SUCCESS( JlGetObjectNumberU64( object, &u64 ) );
    JL_ASSERT( 3 == u64 );

    JL_ASSERT_SUCCESS( JlFreeObjectTree( &objectTree ) );

    return TestReturn;
}